

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# most_common_helper.hpp
# Opt level: O0

multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
* flip_map<long,unsigned_int>
            (map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
             *src)

{
  insert_iterator<std::multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>_>
  __result;
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  *in_RDI;
  insert_iterator<std::multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>_>
  iVar1;
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  *dst;
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  *in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  *in_stack_ffffffffffffffa0;
  _Iter in_stack_ffffffffffffffa8;
  _Rb_tree_const_iterator<std::pair<const_long,_unsigned_int>_> in_stack_ffffffffffffffb0;
  _Rb_tree_const_iterator<std::pair<const_long,_unsigned_int>_> in_stack_ffffffffffffffb8;
  
  std::
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  ::multimap((multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
              *)0x403bb1);
  std::
  map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>::
  begin((map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
         *)in_stack_ffffffffffffff68);
  std::
  map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>::
  end((map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
       *)in_stack_ffffffffffffff68);
  std::
  multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  ::begin(in_stack_ffffffffffffff68);
  iVar1 = std::
          inserter<std::multimap<unsigned_int,long,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,long>>>>
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  __result.iter._M_node = in_stack_ffffffffffffffa8._M_node;
  __result.container = in_stack_ffffffffffffffa0;
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<long_const,unsigned_int>>,std::insert_iterator<std::multimap<unsigned_int,long,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,long>>>>,std::pair<unsigned_int,long>(*)(std::pair<long,unsigned_int>const&)>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__result,
             (_func_pair<unsigned_int,_long>_pair<long,_unsigned_int>_ptr *)iVar1.container);
  return in_RDI;
}

Assistant:

std::multimap<B,A> flip_map(const std::map<A,B> &src)
{
    std::multimap<B,A> dst;
    std::transform(src.begin(), src.end(), std::inserter(dst, dst.begin()),
                   flip_pair<A,B>);
    return dst;
}